

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3FindInIndex(Parse *pParse,Expr *pX,int *prNotFound)

{
  double dVar1;
  byte bVar2;
  Select *pSVar3;
  SrcList *pSVar4;
  Table *pTab;
  Expr *pRight;
  sqlite3 *db;
  Index *pIdx;
  uint uVar5;
  int iDb;
  int iVar6;
  uint uVar7;
  Vdbe *p;
  CollSeq *pCVar8;
  CollSeq *pCVar9;
  KeyInfo *zP4;
  int p2;
  int iVar10;
  Index **ppIVar11;
  int iVar12;
  
  iVar12 = pParse->nTab;
  pParse->nTab = iVar12 + 1;
  p = sqlite3GetVdbe(pParse);
  if ((((((((pX->flags & 0x800) == 0) ||
          (pSVar3 = (pX->x).pSelect, pSVar3 == (Select *)0x0 || pParse->nErr != 0)) ||
         (pSVar3->pPrior != (Select *)0x0)) ||
        (((pSVar3->selFlags & 5) != 0 || (pSVar3->pLimit != (Expr *)0x0)))) ||
       ((pSVar3->pWhere != (Expr *)0x0 ||
        ((pSVar4 = pSVar3->pSrc, pSVar4->nSrc != 1 || (pSVar4->a[0].pSelect != (Select *)0x0))))))
      || (pTab = pSVar4->a[0].pTab, pTab == (Table *)0x0)) ||
     ((((pTab->tabFlags & 0x10) != 0 || (pSVar3->pEList->nExpr != 1)) ||
      (pRight = pSVar3->pEList->a->pExpr, pRight->op != 0x98)))) {
LAB_0017a1cc:
    dVar1 = pParse->nQueryLoop;
    if (prNotFound == (int *)0x0) {
      pParse->nQueryLoop = 1.0;
      iVar12 = 0;
      if (pX->pLeft->iColumn < 0) {
        uVar5 = (uint)((pX->flags & 0x800) == 0);
        iVar10 = 2 - uVar5;
      }
      else {
        iVar10 = 2;
        uVar5 = 0;
      }
    }
    else {
      iVar12 = pParse->nMem + 1;
      pParse->nMem = iVar12;
      *prNotFound = iVar12;
      uVar5 = 0;
      sqlite3VdbeAddOp2(p,10,0,iVar12);
      iVar10 = 2;
    }
    sqlite3CodeSubselect(pParse,pX,iVar12,uVar5);
    pParse->nQueryLoop = dVar1;
  }
  else {
    db = pParse->db;
    uVar5 = (uint)pRight->iColumn;
    iDb = sqlite3SchemaToIndex(db,pTab->pSchema);
    sqlite3CodeVerifySchema(pParse,iDb);
    iVar10 = 0;
    sqlite3TableLock(pParse,iDb,pTab->tnum,'\0',pTab->zName);
    if ((int)uVar5 < 0) {
      uVar5 = sqlite3CodeOnce(pParse);
      sqlite3OpenTable(pParse,iVar12,iDb,pTab,0x27);
      iVar10 = 1;
      if ((-1 < (int)uVar5) && (uVar5 < (uint)p->nOp)) {
        p->aOp[uVar5].p2 = p->nOp;
      }
    }
    else {
      pCVar8 = sqlite3BinaryCompareCollSeq(pParse,pX->pLeft,pRight);
      iVar6 = sqlite3IndexAffinityOk(pX,pTab->aCol[uVar5].affinity);
      ppIVar11 = &pTab->pIndex;
      while (((pIdx = *ppIVar11, pIdx != (Index *)0x0 && (iVar10 == 0)) && (iVar6 != 0))) {
        iVar10 = 0;
        if (*pIdx->aiColumn == uVar5) {
          iVar10 = 0;
          pCVar9 = sqlite3FindCollSeq(db,db->aDb->pSchema->enc,*pIdx->azColl,0);
          if ((pCVar9 == pCVar8) &&
             ((prNotFound != (int *)0x0 ||
              ((iVar10 = 0, pIdx->nColumn == 1 && (pIdx->onError != '\0')))))) {
            zP4 = sqlite3IndexKeyinfo(pParse,pIdx);
            uVar7 = sqlite3CodeOnce(pParse);
            sqlite3VdbeAddOp4(p,0x27,iVar12,pIdx->tnum,iDb,(char *)zP4,-0x10);
            bVar2 = *pIdx->aSortOrder;
            if ((-1 < (int)uVar7) && (uVar7 < (uint)p->nOp)) {
              p->aOp[uVar7].p2 = p->nOp;
            }
            iVar10 = bVar2 + 3;
            if ((prNotFound != (int *)0x0) && (pTab->aCol[uVar5].notNull == '\0')) {
              p2 = pParse->nMem + 1;
              pParse->nMem = p2;
              *prNotFound = p2;
              sqlite3VdbeAddOp2(p,10,0,p2);
            }
          }
        }
        ppIVar11 = &pIdx->pNext;
      }
      if (iVar10 == 0) goto LAB_0017a1cc;
    }
    pX->iTable = iVar12;
  }
  return iVar10;
}

Assistant:

SQLITE_PRIVATE int sqlite3FindInIndex(Parse *pParse, Expr *pX, int *prNotFound){
  Select *p;                            /* SELECT to the right of IN operator */
  int eType = 0;                        /* Type of RHS table. IN_INDEX_* */
  int iTab = pParse->nTab++;            /* Cursor of the RHS table */
  int mustBeUnique = (prNotFound==0);   /* True if RHS must be unique */
  Vdbe *v = sqlite3GetVdbe(pParse);     /* Virtual machine being coded */

  assert( pX->op==TK_IN );

  /* Check to see if an existing table or index can be used to
  ** satisfy the query.  This is preferable to generating a new 
  ** ephemeral table.
  */
  p = (ExprHasProperty(pX, EP_xIsSelect) ? pX->x.pSelect : 0);
  if( ALWAYS(pParse->nErr==0) && isCandidateForInOpt(p) ){
    sqlite3 *db = pParse->db;              /* Database connection */
    Table *pTab;                           /* Table <table>. */
    Expr *pExpr;                           /* Expression <column> */
    int iCol;                              /* Index of column <column> */
    int iDb;                               /* Database idx for pTab */

    assert( p );                        /* Because of isCandidateForInOpt(p) */
    assert( p->pEList!=0 );             /* Because of isCandidateForInOpt(p) */
    assert( p->pEList->a[0].pExpr!=0 ); /* Because of isCandidateForInOpt(p) */
    assert( p->pSrc!=0 );               /* Because of isCandidateForInOpt(p) */
    pTab = p->pSrc->a[0].pTab;
    pExpr = p->pEList->a[0].pExpr;
    iCol = pExpr->iColumn;
   
    /* Code an OP_VerifyCookie and OP_TableLock for <table>. */
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
    sqlite3CodeVerifySchema(pParse, iDb);
    sqlite3TableLock(pParse, iDb, pTab->tnum, 0, pTab->zName);

    /* This function is only called from two places. In both cases the vdbe
    ** has already been allocated. So assume sqlite3GetVdbe() is always
    ** successful here.
    */
    assert(v);
    if( iCol<0 ){
      int iAddr;

      iAddr = sqlite3CodeOnce(pParse);

      sqlite3OpenTable(pParse, iTab, iDb, pTab, OP_OpenRead);
      eType = IN_INDEX_ROWID;

      sqlite3VdbeJumpHere(v, iAddr);
    }else{
      Index *pIdx;                         /* Iterator variable */

      /* The collation sequence used by the comparison. If an index is to
      ** be used in place of a temp-table, it must be ordered according
      ** to this collation sequence.  */
      CollSeq *pReq = sqlite3BinaryCompareCollSeq(pParse, pX->pLeft, pExpr);

      /* Check that the affinity that will be used to perform the 
      ** comparison is the same as the affinity of the column. If
      ** it is not, it is not possible to use any index.
      */
      int affinity_ok = sqlite3IndexAffinityOk(pX, pTab->aCol[iCol].affinity);

      for(pIdx=pTab->pIndex; pIdx && eType==0 && affinity_ok; pIdx=pIdx->pNext){
        if( (pIdx->aiColumn[0]==iCol)
         && sqlite3FindCollSeq(db, ENC(db), pIdx->azColl[0], 0)==pReq
         && (!mustBeUnique || (pIdx->nColumn==1 && pIdx->onError!=OE_None))
        ){
          int iAddr;
          char *pKey;
  
          pKey = (char *)sqlite3IndexKeyinfo(pParse, pIdx);
          iAddr = sqlite3CodeOnce(pParse);
  
          sqlite3VdbeAddOp4(v, OP_OpenRead, iTab, pIdx->tnum, iDb,
                               pKey,P4_KEYINFO_HANDOFF);
          VdbeComment((v, "%s", pIdx->zName));
          assert( IN_INDEX_INDEX_DESC == IN_INDEX_INDEX_ASC+1 );
          eType = IN_INDEX_INDEX_ASC + pIdx->aSortOrder[0];

          sqlite3VdbeJumpHere(v, iAddr);
          if( prNotFound && !pTab->aCol[iCol].notNull ){
            *prNotFound = ++pParse->nMem;
            sqlite3VdbeAddOp2(v, OP_Null, 0, *prNotFound);
          }
        }
      }
    }
  }

  if( eType==0 ){
    /* Could not found an existing table or index to use as the RHS b-tree.
    ** We will have to generate an ephemeral table to do the job.
    */
    double savedNQueryLoop = pParse->nQueryLoop;
    int rMayHaveNull = 0;
    eType = IN_INDEX_EPH;
    if( prNotFound ){
      *prNotFound = rMayHaveNull = ++pParse->nMem;
      sqlite3VdbeAddOp2(v, OP_Null, 0, *prNotFound);
    }else{
      testcase( pParse->nQueryLoop>(double)1 );
      pParse->nQueryLoop = (double)1;
      if( pX->pLeft->iColumn<0 && !ExprHasAnyProperty(pX, EP_xIsSelect) ){
        eType = IN_INDEX_ROWID;
      }
    }
    sqlite3CodeSubselect(pParse, pX, rMayHaveNull, eType==IN_INDEX_ROWID);
    pParse->nQueryLoop = savedNQueryLoop;
  }else{
    pX->iTable = iTab;
  }
  return eType;
}